

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O0

void __thiscall UnitTest_lex2::~UnitTest_lex2(UnitTest_lex2 *this)

{
  UnitTestBase::~UnitTestBase(&this->super_UnitTestBase);
  return;
}

Assistant:

TEST_CASE(lex2)
{
    LexerWrapper lexer("-- this is comment\n"
                       "--[[this is long\n comment]]"
                       "--[[this is long\n comment too--]]"
                       "--[[incomplete comment]");

    EXPECT_EXCEPTION(luna::LexException, {
        lexer.GetToken();
    });
}